

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O3

uint32_t helper_saddsubx_arm(uint32_t a,uint32_t b,void *gep)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  uVar3 = (int)(short)a - ((int)b >> 0x10);
  iVar1 = (int)~uVar3 >> 0x1f;
  iVar2 = (int)(short)b + ((int)a >> 0x10);
  iVar4 = iVar1 * -3 + 0xc;
  if (iVar2 < 0) {
    iVar4 = iVar1 * -3;
  }
  *(int *)gep = iVar4;
  return iVar2 * 0x10000 | uVar3 & 0xffff;
}

Assistant:

uint32_t HELPER(glue(PFX,addsubx))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    SUB16(a, b >> 16, 0);
    ADD16(a >> 16, b, 1);
    SET_GE;
    return res;
}